

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true> __thiscall
duckdb::ColumnWriter::CreateWriterRecursive
          (ColumnWriter *this,ClientContext *context,ParquetWriter *writer,
          vector<duckdb_parquet::SchemaElement,_true> *parquet_schemas,ParquetColumnSchema *schema,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *path_in_schema)

{
  LogicalType *this_00;
  vector<duckdb::ParquetColumnSchema,_true> *this_01;
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  ParquetColumnSchema *pPVar3;
  ParquetWriter *args;
  _Head_base<0UL,_duckdb::ColumnWriter_*,_false> _Var4;
  pointer puVar5;
  bool bVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  InternalException *this_02;
  ParquetColumnSchema *pPVar9;
  size_type __n;
  bool can_have_nulls;
  ParquetColumnSchema *local_f8;
  ParquetWriter *local_f0;
  _Head_base<0UL,_duckdb::ColumnWriter_*,_false> local_e8;
  undefined1 local_e0 [8];
  vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
  child_writers;
  _func_int **local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98 [24];
  string local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48 [24];
  
  local_f0 = writer;
  local_e8._M_head_impl = this;
  pvVar7 = vector<duckdb_parquet::SchemaElement,_true>::get<true>
                     (parquet_schemas,schema->schema_index);
  can_have_nulls = pvVar7->repetition_type == OPTIONAL;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)path_in_schema,&schema->name);
  LVar1 = (schema->type).id_;
  local_f8 = schema;
  if ((LVar1 == UNION) || (LVar1 == STRUCT)) {
    child_writers.
    super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    child_writers.
    super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    child_writers.
    super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::reserve(&child_writers.
               super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
              ,((long)(schema->children).
                      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                      .
                      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(schema->children).
                     super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     .
                     super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x90);
    pPVar3 = (schema->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pPVar9 = (schema->children).
                  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                  .
                  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                  ._M_impl.super__Vector_impl_data._M_start; pPVar9 != pPVar3; pPVar9 = pPVar9 + 1)
    {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(local_48,&path_in_schema->
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      CreateWriterRecursive
                ((ColumnWriter *)local_e0,context,local_f0,parquet_schemas,pPVar9,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_48);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
                  *)&child_writers,
                 (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                  *)local_e0);
      if (local_e0 != (undefined1  [8])0x0) {
        (*((ColumnWriter *)local_e0)->_vptr_ColumnWriter[1])();
      }
      local_e0 = (undefined1  [8])0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_48);
    }
    make_uniq<duckdb::StructColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,duckdb::vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,true>,bool&>
              ((duckdb *)local_e0,local_f0,local_f8,path_in_schema,&child_writers,&can_have_nulls);
    _Var4._M_head_impl = local_e8._M_head_impl;
    *(undefined1 (*) [8])local_e8._M_head_impl = local_e0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::~vector(&child_writers.
               super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
             );
    return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
           _Var4._M_head_impl;
  }
  this_00 = &schema->type;
  if (LVar1 == BLOB) {
    LogicalType::GetAlias_abi_cxx11_((string *)&child_writers,this_00);
    bVar6 = ::std::operator==((string *)&child_writers,"WKB_BLOB");
    if (bVar6) {
      bVar6 = GeoParquetFileMetadata::IsGeoParquetConversionEnabled(context);
      ::std::__cxx11::string::~string((string *)&child_writers);
      if (bVar6) {
        make_uniq<duckdb::WKBColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&,std::__cxx11::string_const&>
                  ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls,
                   &schema->name);
        puVar5 = child_writers.
                 super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var4._M_head_impl = local_e8._M_head_impl;
        child_writers.
        super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_e8._M_head_impl)->_vptr_ColumnWriter = (_func_int **)puVar5;
        ::std::unique_ptr<duckdb::WKBColumnWriter,_std::default_delete<duckdb::WKBColumnWriter>_>::
        ~unique_ptr((unique_ptr<duckdb::WKBColumnWriter,_std::default_delete<duckdb::WKBColumnWriter>_>
                     *)&child_writers);
        return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
               _Var4._M_head_impl;
      }
    }
    else {
      ::std::__cxx11::string::~string((string *)&child_writers);
    }
    LVar1 = this_00->id_;
  }
  else {
    if (LVar1 == ARRAY) {
LAB_00dd21f8:
      ::std::__cxx11::string::string((string *)&child_writers,"list",(allocator *)local_e0);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)path_in_schema
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &child_writers);
      ::std::__cxx11::string::~string((string *)&child_writers);
      pvVar8 = vector<duckdb::ParquetColumnSchema,_true>::get<true>(&local_f8->children,0);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(local_98,&path_in_schema->
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      CreateWriterRecursive
                ((ColumnWriter *)&child_writers,context,local_f0,parquet_schemas,pvVar8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_98);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_98);
      if (LVar1 == LIST) {
        make_uniq<duckdb::ListColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,bool&>
                  ((duckdb *)local_e0,local_f0,local_f8,path_in_schema,
                   (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                    *)&child_writers,&can_have_nulls);
      }
      else {
        make_uniq<duckdb::ArrayColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,bool&>
                  ((duckdb *)local_e0,local_f0,local_f8,path_in_schema,
                   (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                    *)&child_writers,&can_have_nulls);
      }
      *(undefined1 (*) [8])local_e8._M_head_impl = local_e0;
      if (child_writers.
          super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
               local_e8._M_head_impl;
      }
      (*(code *)(((child_writers.
                   super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>)
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ColumnWriter_*,_std::default_delete<duckdb::ColumnWriter>_>
                 .super__Head_base<0UL,_duckdb::ColumnWriter_*,_false>._M_head_impl)->writer)();
      return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
             local_e8._M_head_impl;
    }
    if (LVar1 == MAP) {
      ::std::__cxx11::string::string((string *)&child_writers,"key_value",(allocator *)local_e0);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)path_in_schema
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &child_writers);
      ::std::__cxx11::string::~string((string *)&child_writers);
      child_writers.
      super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      child_writers.
      super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      child_writers.
      super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ::reserve(&child_writers.
                 super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                ,2);
      this_01 = &local_f8->children;
      for (__n = 0; args = local_f0, pPVar9 = local_f8, __n != 2; __n = __n + 1) {
        pvVar8 = vector<duckdb::ParquetColumnSchema,_true>::get<true>(this_01,__n);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(local_60,&path_in_schema->
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
        CreateWriterRecursive
                  ((ColumnWriter *)local_e0,context,local_f0,parquet_schemas,pvVar8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)local_60);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_60);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
                    *)&child_writers,
                   (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                    *)local_e0);
        if (local_e0 != (undefined1  [8])0x0) {
          (*((ColumnWriter *)local_e0)->_vptr_ColumnWriter[1])();
        }
      }
      make_uniq<duckdb::StructColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,true>,bool&>
                ((duckdb *)local_e0,local_f0,local_f8,path_in_schema,&child_writers,&can_have_nulls)
      ;
      make_uniq<duckdb::ListColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>&,duckdb::unique_ptr<duckdb::StructColumnWriter,std::default_delete<duckdb::StructColumnWriter>,true>,bool&>
                ((duckdb *)&local_a0,args,pPVar9,path_in_schema,
                 (unique_ptr<duckdb::StructColumnWriter,_std::default_delete<duckdb::StructColumnWriter>,_true>
                  *)local_e0,&can_have_nulls);
      (local_e8._M_head_impl)->_vptr_ColumnWriter = local_a0;
      if ((tuple<duckdb::StructColumnWriter_*,_std::default_delete<duckdb::StructColumnWriter>_>)
          local_e0 != (_Head_base<0UL,_duckdb::StructColumnWriter_*,_false>)0x0) {
        (**(code **)(*(_func_int **)local_e0 + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ::~vector(&child_writers.
                 super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
               );
      return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
             local_e8._M_head_impl;
    }
    if (LVar1 == LIST) goto LAB_00dd21f8;
  }
  switch(LVar1) {
  case BOOLEAN:
    make_uniq<duckdb::BooleanColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case TINYINT:
    make_uniq<duckdb::StandardColumnWriter<signed_char,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case INTEGER:
  case DATE:
switchD_00dd24d6_caseD_d:
    make_uniq<duckdb::StandardColumnWriter<int,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case BIGINT:
  case TIME:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_TZ:
switchD_00dd24d6_caseD_e:
    make_uniq<duckdb::StandardColumnWriter<long,long,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case TIMESTAMP_SEC:
    make_uniq<duckdb::StandardColumnWriter<long,long,duckdb::ParquetTimestampSOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case TIMESTAMP_NS:
    make_uniq<duckdb::StandardColumnWriter<long,long,duckdb::ParquetTimestampNSOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case DECIMAL:
    PVar2 = (local_f8->type).physical_type_;
    if (PVar2 == INT64) goto switchD_00dd24d6_caseD_e;
    if (PVar2 == INT32) goto switchD_00dd24d6_caseD_d;
    if (PVar2 != INT16) {
      make_uniq<duckdb::FixedDecimalColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
                ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
      break;
    }
  case SMALLINT:
    make_uniq<duckdb::StandardColumnWriter<short,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case FLOAT:
    make_uniq<duckdb::StandardColumnWriter<duckdb::float_na_equal,float,duckdb::FloatingPointOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case DOUBLE:
    make_uniq<duckdb::StandardColumnWriter<duckdb::double_na_equal,double,duckdb::FloatingPointOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case CHAR:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_00dd24d6_caseD_18:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&child_writers,"Unsupported type \"%s\" in Parquet writer",
               (allocator *)local_e0);
    LogicalType::ToString_abi_cxx11_(&local_80,this_00);
    InternalException::InternalException<std::__cxx11::string>
              (this_02,(string *)&child_writers,&local_80);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case VARCHAR:
    make_uniq<duckdb::StandardColumnWriter<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case BLOB:
    make_uniq<duckdb::StandardColumnWriter<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case INTERVAL:
    make_uniq<duckdb::StandardColumnWriter<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case UTINYINT:
    make_uniq<duckdb::StandardColumnWriter<unsigned_char,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case USMALLINT:
    make_uniq<duckdb::StandardColumnWriter<unsigned_short,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case UINTEGER:
    make_uniq<duckdb::StandardColumnWriter<unsigned_int,unsigned_int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case UBIGINT:
    make_uniq<duckdb::StandardColumnWriter<unsigned_long,unsigned_long,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case TIME_TZ:
    make_uniq<duckdb::StandardColumnWriter<duckdb::dtime_tz_t,long,duckdb::ParquetTimeTZOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case UHUGEINT:
    make_uniq<duckdb::StandardColumnWriter<duckdb::uhugeint_t,double,duckdb::ParquetUhugeintOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case HUGEINT:
    make_uniq<duckdb::StandardColumnWriter<duckdb::hugeint_t,double,duckdb::ParquetHugeintOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  case UUID:
    make_uniq<duckdb::StandardColumnWriter<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
    break;
  default:
    if (LVar1 != ENUM) goto switchD_00dd24d6_caseD_18;
    make_uniq<duckdb::EnumColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&child_writers,local_f0,local_f8,path_in_schema,&can_have_nulls);
  }
  (local_e8._M_head_impl)->_vptr_ColumnWriter =
       (_func_int **)
       child_writers.
       super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
         local_e8._M_head_impl;
}

Assistant:

unique_ptr<ColumnWriter>
ColumnWriter::CreateWriterRecursive(ClientContext &context, ParquetWriter &writer,
                                    const vector<duckdb_parquet::SchemaElement> &parquet_schemas,
                                    const ParquetColumnSchema &schema, vector<string> path_in_schema) {
	auto &type = schema.type;
	auto can_have_nulls = parquet_schemas[schema.schema_index].repetition_type == FieldRepetitionType::OPTIONAL;
	path_in_schema.push_back(schema.name);
	if (type.id() == LogicalTypeId::STRUCT || type.id() == LogicalTypeId::UNION) {
		// construct the child writers recursively
		vector<unique_ptr<ColumnWriter>> child_writers;
		child_writers.reserve(schema.children.size());
		for (auto &child_column : schema.children) {
			child_writers.push_back(
			    CreateWriterRecursive(context, writer, parquet_schemas, child_column, path_in_schema));
		}
		return make_uniq<StructColumnWriter>(writer, schema, std::move(path_in_schema), std::move(child_writers),
		                                     can_have_nulls);
	}
	if (type.id() == LogicalTypeId::LIST || type.id() == LogicalTypeId::ARRAY) {
		auto is_list = type.id() == LogicalTypeId::LIST;
		path_in_schema.push_back("list");
		auto child_writer = CreateWriterRecursive(context, writer, parquet_schemas, schema.children[0], path_in_schema);
		if (is_list) {
			return make_uniq<ListColumnWriter>(writer, schema, std::move(path_in_schema), std::move(child_writer),
			                                   can_have_nulls);
		} else {
			return make_uniq<ArrayColumnWriter>(writer, schema, std::move(path_in_schema), std::move(child_writer),
			                                    can_have_nulls);
		}
	}
	if (type.id() == LogicalTypeId::MAP) {
		path_in_schema.push_back("key_value");
		// construct the child types recursively
		vector<unique_ptr<ColumnWriter>> child_writers;
		child_writers.reserve(2);
		for (idx_t i = 0; i < 2; i++) {
			// key needs to be marked as REQUIRED
			auto child_writer =
			    CreateWriterRecursive(context, writer, parquet_schemas, schema.children[i], path_in_schema);
			child_writers.push_back(std::move(child_writer));
		}
		auto struct_writer =
		    make_uniq<StructColumnWriter>(writer, schema, path_in_schema, std::move(child_writers), can_have_nulls);
		return make_uniq<ListColumnWriter>(writer, schema, path_in_schema, std::move(struct_writer), can_have_nulls);
	}
	if (type.id() == LogicalTypeId::BLOB && type.GetAlias() == "WKB_BLOB" &&
	    GeoParquetFileMetadata::IsGeoParquetConversionEnabled(context)) {
		return make_uniq<WKBColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls, schema.name);
	}

	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		return make_uniq<BooleanColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::TINYINT:
		return make_uniq<StandardColumnWriter<int8_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                        can_have_nulls);
	case LogicalTypeId::SMALLINT:
		return make_uniq<StandardColumnWriter<int16_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::DATE:
		return make_uniq<StandardColumnWriter<int32_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::TIME:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
	case LogicalTypeId::TIMESTAMP_MS:
		return make_uniq<StandardColumnWriter<int64_t, int64_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::TIME_TZ:
		return make_uniq<StandardColumnWriter<dtime_tz_t, int64_t, ParquetTimeTZOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::HUGEINT:
		return make_uniq<StandardColumnWriter<hugeint_t, double, ParquetHugeintOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::UHUGEINT:
		return make_uniq<StandardColumnWriter<uhugeint_t, double, ParquetUhugeintOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::TIMESTAMP_NS:
		return make_uniq<StandardColumnWriter<int64_t, int64_t, ParquetTimestampNSOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::TIMESTAMP_SEC:
		return make_uniq<StandardColumnWriter<int64_t, int64_t, ParquetTimestampSOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::UTINYINT:
		return make_uniq<StandardColumnWriter<uint8_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::USMALLINT:
		return make_uniq<StandardColumnWriter<uint16_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                          can_have_nulls);
	case LogicalTypeId::UINTEGER:
		return make_uniq<StandardColumnWriter<uint32_t, uint32_t>>(writer, schema, std::move(path_in_schema),
		                                                           can_have_nulls);
	case LogicalTypeId::UBIGINT:
		return make_uniq<StandardColumnWriter<uint64_t, uint64_t>>(writer, schema, std::move(path_in_schema),
		                                                           can_have_nulls);
	case LogicalTypeId::FLOAT:
		return make_uniq<StandardColumnWriter<float_na_equal, float, FloatingPointOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::DOUBLE:
		return make_uniq<StandardColumnWriter<double_na_equal, double, FloatingPointOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::DECIMAL:
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return make_uniq<StandardColumnWriter<int16_t, int32_t>>(writer, schema, std::move(path_in_schema),
			                                                         can_have_nulls);
		case PhysicalType::INT32:
			return make_uniq<StandardColumnWriter<int32_t, int32_t>>(writer, schema, std::move(path_in_schema),
			                                                         can_have_nulls);
		case PhysicalType::INT64:
			return make_uniq<StandardColumnWriter<int64_t, int64_t>>(writer, schema, std::move(path_in_schema),
			                                                         can_have_nulls);
		default:
			return make_uniq<FixedDecimalColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls);
		}
	case LogicalTypeId::BLOB:
		return make_uniq<StandardColumnWriter<string_t, string_t, ParquetBlobOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::VARCHAR:
		return make_uniq<StandardColumnWriter<string_t, string_t, ParquetStringOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::UUID:
		return make_uniq<StandardColumnWriter<hugeint_t, ParquetUUIDTargetType, ParquetUUIDOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::INTERVAL:
		return make_uniq<StandardColumnWriter<interval_t, ParquetIntervalTargetType, ParquetIntervalOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::ENUM:
		return make_uniq<EnumColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls);
	default:
		throw InternalException("Unsupported type \"%s\" in Parquet writer", type.ToString());
	}
}